

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall BufferTest_Resize_Test::TestBody(BufferTest_Resize_Test *this)

{
  MockSpec<void_(unsigned_long)> *pMVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  AssertHelper local_130;
  AssertionResult gtest_ar;
  mock_buffer<char> buffer;
  char data [123];
  
  mock_buffer<char>::mock_buffer(&buffer,data,0x7b);
  buffer.super_basic_buffer<char>.ptr_[10] = '*';
  local_138.ptr_._0_4_ = 0x2a;
  testing::internal::CmpHelperEQ<int,char>
            ((internal *)&gtest_ar,"42","buffer[10]",(int *)&local_138,
             buffer.super_basic_buffer<char>.ptr_ + 10);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::internal::basic_buffer<char>::resize(&buffer.super_basic_buffer<char>,0x14);
  local_130.data_._0_4_ = 0x14;
  local_138.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       buffer.super_basic_buffer<char>.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"20u","buffer.size()",(uint *)&local_130,
             (unsigned_long *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_130.data_._0_4_ = 0x7b;
  local_138.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       buffer.super_basic_buffer<char>.capacity_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"123u","buffer.capacity()",(uint *)&local_130,
             (unsigned_long *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_138.ptr_._0_4_ = 0x2a;
  testing::internal::CmpHelperEQ<int,char>
            ((internal *)&gtest_ar,"42","buffer[10]",(int *)&local_138,
             buffer.super_basic_buffer<char>.ptr_ + 10);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::internal::basic_buffer<char>::resize(&buffer.super_basic_buffer<char>,5);
  local_130.data_._0_4_ = 5;
  local_138.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       buffer.super_basic_buffer<char>.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"5u","buffer.size()",(uint *)&local_130,
             (unsigned_long *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_130.data_._0_4_ = 0x7b;
  local_138.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       buffer.super_basic_buffer<char>.capacity_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"123u","buffer.capacity()",(uint *)&local_130,
             (unsigned_long *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_138.ptr_._0_4_ = 0x2a;
  testing::internal::CmpHelperEQ<int,char>
            ((internal *)&gtest_ar,"42","buffer[10]",(int *)&local_138,
             buffer.super_basic_buffer<char>.ptr_ + 10);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&gtest_ar,0x7c);
  pMVar1 = mock_buffer<char>::gmock_do_grow(&buffer,(Matcher<unsigned_long> *)&gtest_ar);
  testing::internal::MockSpec<void_(unsigned_long)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0xa8,"buffer","do_grow(124)");
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&gtest_ar);
  fmt::v5::internal::basic_buffer<char>::resize(&buffer.super_basic_buffer<char>,0x7c);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&gtest_ar,200);
  pMVar1 = mock_buffer<char>::gmock_do_grow(&buffer,(Matcher<unsigned_long> *)&gtest_ar);
  testing::internal::MockSpec<void_(unsigned_long)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0xaa,"buffer","do_grow(200)");
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&gtest_ar);
  fmt::v5::internal::basic_buffer<char>::resize(&buffer.super_basic_buffer<char>,200);
  mock_buffer<char>::~mock_buffer(&buffer);
  return;
}

Assistant:

TEST(BufferTest, Resize) {
  char data[123];
  mock_buffer<char> buffer(data, sizeof(data));
  buffer[10] = 42;
  EXPECT_EQ(42, buffer[10]);
  buffer.resize(20);
  EXPECT_EQ(20u, buffer.size());
  EXPECT_EQ(123u, buffer.capacity());
  EXPECT_EQ(42, buffer[10]);
  buffer.resize(5);
  EXPECT_EQ(5u, buffer.size());
  EXPECT_EQ(123u, buffer.capacity());
  EXPECT_EQ(42, buffer[10]);
  // Check if resize calls grow.
  EXPECT_CALL(buffer, do_grow(124));
  buffer.resize(124);
  EXPECT_CALL(buffer, do_grow(200));
  buffer.resize(200);
}